

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidateDoc(xmlSchemaValidCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlNodePtr pxVar1;
  xmlDocPtr doc_local;
  xmlSchemaValidCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlSchemaValidCtxtPtr)0x0) || (doc == (xmlDocPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    ctxt->doc = doc;
    pxVar1 = xmlDocGetRootElement(doc);
    ctxt->node = pxVar1;
    if (ctxt->node == (xmlNodePtr)0x0) {
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAV_DOCUMENT_ELEMENT_MISSING,
                         (xmlNodePtr)doc,(xmlSchemaBasicItemPtr)0x0,
                         "The document has no document element",(xmlChar *)0x0,(xmlChar *)0x0);
      ctxt_local._4_4_ = ctxt->err;
    }
    else {
      ctxt->validationRoot = ctxt->node;
      ctxt_local._4_4_ = xmlSchemaVStart(ctxt);
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlSchemaValidateDoc(xmlSchemaValidCtxtPtr ctxt, xmlDocPtr doc)
{
    if ((ctxt == NULL) || (doc == NULL))
        return (-1);

    ctxt->doc = doc;
    ctxt->node = xmlDocGetRootElement(doc);
    if (ctxt->node == NULL) {
        xmlSchemaCustomErr(ACTXT_CAST ctxt,
	    XML_SCHEMAV_DOCUMENT_ELEMENT_MISSING,
	    (xmlNodePtr) doc, NULL,
	    "The document has no document element", NULL, NULL);
        return (ctxt->err);
    }
    ctxt->validationRoot = ctxt->node;
    return (xmlSchemaVStart(ctxt));
}